

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_direction_node.cpp
# Opt level: O0

void __thiscall random_direction_node::reflect(random_direction_node *this,int err)

{
  bool bVar1;
  result_type rVar2;
  undefined1 local_38 [8];
  uniform_real_distribution<double> randomPitch;
  uniform_real_distribution<double> randomDir;
  int err_local;
  random_direction_node *this_local;
  
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)&randomPitch._M_param._M_b,0.0,6.283185307179586);
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)local_38,0.0,3.141592653589793);
  if (err != (this->super_node).lastErr) {
    if (err == 1) {
      do {
        rVar2 = std::uniform_real_distribution<double>::operator()
                          ((uniform_real_distribution<double> *)&randomPitch._M_param._M_b,&e);
        (this->super_node).d = rVar2;
        rVar2 = std::uniform_real_distribution<double>::operator()
                          ((uniform_real_distribution<double> *)local_38,&e);
        (this->super_node).p = rVar2;
        bVar1 = false;
        if (1.5707963267948966 <= (this->super_node).d) {
          bVar1 = (this->super_node).d <= 4.71238898038469;
        }
      } while (bVar1);
    }
    else if (err == 2) {
      do {
        rVar2 = std::uniform_real_distribution<double>::operator()
                          ((uniform_real_distribution<double> *)&randomPitch._M_param._M_b,&e);
        (this->super_node).d = rVar2;
        rVar2 = std::uniform_real_distribution<double>::operator()
                          ((uniform_real_distribution<double> *)local_38,&e);
        (this->super_node).p = rVar2;
        bVar1 = true;
        if (1.5707963267948966 < (this->super_node).d) {
          bVar1 = 4.71238898038469 <= (this->super_node).d;
        }
      } while (bVar1);
    }
    else if (err == 3) {
      do {
        rVar2 = std::uniform_real_distribution<double>::operator()
                          ((uniform_real_distribution<double> *)&randomPitch._M_param._M_b,&e);
        (this->super_node).d = rVar2;
        rVar2 = std::uniform_real_distribution<double>::operator()
                          ((uniform_real_distribution<double> *)local_38,&e);
        (this->super_node).p = rVar2;
      } while (3.141592653589793 <= (this->super_node).d);
    }
    else if (err == 4) {
      do {
        rVar2 = std::uniform_real_distribution<double>::operator()
                          ((uniform_real_distribution<double> *)&randomPitch._M_param._M_b,&e);
        (this->super_node).d = rVar2;
        rVar2 = std::uniform_real_distribution<double>::operator()
                          ((uniform_real_distribution<double> *)local_38,&e);
        (this->super_node).p = rVar2;
      } while ((this->super_node).d <= 3.141592653589793);
    }
    else if (err == 5) {
      do {
        rVar2 = std::uniform_real_distribution<double>::operator()
                          ((uniform_real_distribution<double> *)&randomPitch._M_param._M_b,&e);
        (this->super_node).d = rVar2;
        rVar2 = std::uniform_real_distribution<double>::operator()
                          ((uniform_real_distribution<double> *)local_38,&e);
        (this->super_node).p = rVar2;
      } while (1.5707963267948966 <= (this->super_node).p);
    }
    else if (err == 6) {
      do {
        rVar2 = std::uniform_real_distribution<double>::operator()
                          ((uniform_real_distribution<double> *)&randomPitch._M_param._M_b,&e);
        (this->super_node).d = rVar2;
        rVar2 = std::uniform_real_distribution<double>::operator()
                          ((uniform_real_distribution<double> *)local_38,&e);
        (this->super_node).p = rVar2;
      } while ((this->super_node).p <= 1.5707963267948966);
    }
    (this->super_node).lastErr = err;
    (this->super_node).field_0x39 = 1;
  }
  return;
}

Assistant:

void random_direction_node::reflect(int err){      //err: 1 XMIN 2 XMAX 3 YMIN 4 YMAX
    uniform_real_distribution<double> randomDir(0,2*M_PI);
    uniform_real_distribution<double> randomPitch(0,M_PI);
    if (err == lastErr) {           //In case random_direction_node reflect forever near an edge
        return;
    }
    if(err == 1){
        do{
            d = randomDir(e);
            p = randomPitch(e);
        }while(d >= M_PI/2 && d <= 3*M_PI/2);
    }else if(err == 2){
        do{
            d = randomDir(e);
            p = randomPitch(e);
        }while(d <= M_PI/2 || d >= 3*M_PI/2);
    }else if(err == 3){
        do{
            d = randomDir(e);
            p = randomPitch(e);
        }while(d >= M_PI);
    }else if(err == 4){
        do{
            d = randomDir(e);
            p = randomPitch(e);
        }while(d <= M_PI);
    }else if(err == 5){
        do{
            d = randomDir(e);
            p = randomPitch(e);
        }while(p >= 0.5*M_PI);
    }else if(err == 6){
        do{
            d = randomDir(e);
            p = randomPitch(e);
        }while(p <= 0.5*M_PI);
    }
    lastErr = err;
    reflected = true;
}